

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

int macro_dis_dst(char *out,uint32_t c)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint32_t c_00;
  char *pcVar6;
  
  pcVar6 = mcr_parmsend;
  pcVar5 = mcr_maddr;
  pcVar3 = mcr_parm;
  c_00 = (uint32_t)out;
  uVar1 = c_00 & 0x70;
  pcVar4 = mcr_mov;
  if (uVar1 == 0x10) {
LAB_0024dbf9:
    reg1_str(c_00);
    pcVar5 = "%s %s";
LAB_0024dc0c:
    sprintf(outs,pcVar5,pcVar4,reg1_str::r);
    return 0;
  }
  if (((ulong)out & 0x70) == 0) {
    reg1_str(c_00);
    pcVar5 = "%s %s ign";
    pcVar4 = pcVar3;
    goto LAB_0024dc0c;
  }
  uVar2 = c_00 & 0x770;
  if (uVar2 == 0x20) {
LAB_0024dc35:
    strcpy(outs,pcVar5);
    return 1;
  }
  if (uVar1 == 0x30) {
    reg1_str(c_00);
    sprintf(outs,"%s %s %s",pcVar3,reg1_str::r,mcr_send);
    return 0;
  }
  pcVar4 = mcr_maddr;
  if (uVar1 == 0x20) {
LAB_0024dc54:
    reg1_str(c_00);
    pcVar3 = reg1_str::r;
LAB_0024dc71:
    sprintf(outs,"%s %s",pcVar4,pcVar3);
  }
  else {
    if (uVar2 == 0x40) {
      strcpy(outs,mcr_send);
      return 0;
    }
    if (uVar1 == 0x50) {
      reg1_str(c_00);
      pcVar5 = reg1_str::r;
      pcVar6 = mcr_maddr;
    }
    else {
      pcVar4 = mcr_send;
      if (uVar1 == 0x40) goto LAB_0024dbf9;
      pcVar3 = mcr_maddr;
      pcVar4 = mcr_parmsend;
      if (uVar2 == 0x60) goto LAB_0024dc71;
      if (uVar1 != 0x60) {
        pcVar5 = mcr_maddrsend;
        if (uVar2 == 0x70) goto LAB_0024dc35;
        pcVar4 = mcr_maddrsend;
        if (uVar1 != 0x70) {
          builtin_strncpy(outs,"???",4);
          return 0;
        }
        goto LAB_0024dc54;
      }
      reg1_str(c_00);
      pcVar3 = pcVar6;
      pcVar6 = reg1_str::r;
    }
    sprintf(outs,"%s %s %s",pcVar3,pcVar5,pcVar6);
  }
  return 1;
}

Assistant:

static int macro_dis_dst(char *out, uint32_t c)
{
	int expects_maddr = 0;
	if ((c & 0x00000070) == 0x00000000)
	{
		// { 0x00000000, 0x00000070, N("parm"), REG1, N("ign") }
		sprintf(out, "%s %s ign", mcr_parm, reg1_str(c));
	}
	else if ((c & 0x00000070) == 0x00000010)
	{
		// { 0x00000010, 0x00000070, N("mov"), REG1 }
		sprintf(out, "%s %s", mcr_mov, reg1_str(c));
	}
	else if ((c & 0x00000770) == 0x00000020)
	{
		// { 0x00000020, 0x00000770, N("maddr") }
		sprintf(out, "%s", mcr_maddr);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000020)
	{
		// { 0x00000020, 0x00000070, N("maddr"), REG1 }
		sprintf(out, "%s %s", mcr_maddr, reg1_str(c));
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000030)
	{
		// { 0x00000030, 0x00000070, N("parm"), REG1, N("send") }
		sprintf(out, "%s %s %s", mcr_parm, reg1_str(c), mcr_send);
	}
	else if ((c & 0x00000770) == 0x00000040)
	{
		// { 0x00000040, 0x00000770, N("send") }
		sprintf(out, "%s", mcr_send);
	}
	else if ((c & 0x00000070) == 0x00000040)
	{
		// { 0x00000040, 0x00000070, N("send"), REG1 }
		sprintf(out, "%s %s", mcr_send, reg1_str(c));
	}
	else if ((c & 0x00000070) == 0x00000050)
	{
		// { 0x00000050, 0x00000070, N("parm"), REG1, N("maddr") }
		sprintf(out, "%s %s %s", mcr_parm, reg1_str(c), mcr_maddr);
		return 1;
	}
	else if ((c & 0x00000770) == 0x00000060)
	{
		// { 0x00000060, 0x00000770, N("parmsend"), N("maddr") }
		sprintf(out, "%s %s", mcr_parmsend, mcr_maddr);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000060)
	{
		// { 0x00000060, 0x00000070, N("parmsend"), N("maddr"), REG1 }
		sprintf(out, "%s %s %s", mcr_parmsend, mcr_maddr, reg1_str(c));
		expects_maddr = 1;
	}
	else if ((c & 0x00000770) == 0x00000070)
	{
		// { 0x00000070, 0x00000770, N("maddrsend") }
		sprintf(out, "%s", mcr_maddrsend);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000070)
	{
		// { 0x00000070, 0x00000070, N("maddrsend"), REG1 }
		sprintf(out, "%s %s", mcr_maddrsend, reg1_str(c));
		expects_maddr = 1;
	}
	else
		sprintf(out, "???");

	return expects_maddr;
}